

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_handler.c
# Opt level: O0

c_int lh_unload_lib(soHandle_t h)

{
  int iVar1;
  undefined8 in_RDI;
  c_int rc;
  
  iVar1 = dlclose(in_RDI);
  return (long)iVar1;
}

Assistant:

c_int lh_unload_lib (soHandle_t h) {
    c_int rc = 1;

#ifdef IS_WINDOWS
    rc = FreeLibrary (h);
    rc = ! rc;
#else
    rc = dlclose (h);
#endif

    return rc;
}